

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_1::checkRequiredGLRobustnessExtension(EGLint *attribList,Functions *gl)

{
  Functions *pFVar1;
  bool bVar2;
  NotSupportedError *this;
  char *message;
  byte local_ea;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  byte local_8b;
  byte local_8a;
  allocator<char> local_89;
  string local_88;
  ApiType local_68;
  allocator<char> local_51;
  string local_50;
  ApiType local_2c;
  deUint32 local_28;
  EGLint local_24;
  ApiType apiType;
  EGLint robustAccessExt;
  EGLint minorVersion;
  EGLint majorVersion;
  Functions *gl_local;
  EGLint *attribList_local;
  
  robustAccessExt = 1;
  apiType.m_bits = 0;
  local_24 = 0;
  _minorVersion = gl;
  gl_local = (Functions *)attribList;
  parseAttributeValues(attribList,&robustAccessExt,(EGLint *)&apiType,&local_24);
  local_2c = glu::ApiType::es(robustAccessExt,apiType.m_bits);
  pFVar1 = _minorVersion;
  local_28 = local_2c.m_bits;
  std::allocator<char>::allocator();
  local_8a = 0;
  local_8b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"GL_KHR_robustness",&local_51);
  bVar2 = glu::hasExtension(pFVar1,local_2c,&local_50);
  pFVar1 = _minorVersion;
  local_ea = 0;
  if (!bVar2) {
    local_68.m_bits = local_28;
    std::allocator<char>::allocator();
    local_8a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"GL_EXT_robustness",&local_89);
    local_8b = 1;
    bVar2 = glu::hasExtension(pFVar1,local_68,&local_88);
    local_ea = bVar2 ^ 0xff;
  }
  if ((local_8b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((local_8a & 1) != 0) {
    std::allocator<char>::~allocator(&local_89);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  if ((local_ea & 1) != 0) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"GL_KHR_robustness and GL_EXT_robustness",&local_d1);
    std::operator+(&local_b0,&local_d0," not supported");
    message = (char *)std::__cxx11::string::c_str();
    tcu::NotSupportedError::NotSupportedError
              (this,message,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
               ,0x101);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
  }
  return;
}

Assistant:

void checkRequiredGLRobustnessExtension (const EGLint* attribList, const glw::Functions& gl)
{
	EGLint				majorVersion			= 1;
	EGLint				minorVersion			= 0;
	EGLint				robustAccessExt			= 0;
	parseAttributeValues(attribList, majorVersion, minorVersion, robustAccessExt);

	glu::ApiType		apiType					= glu::ApiType::es(majorVersion, minorVersion);

	if (!glu::hasExtension(gl, apiType, "GL_KHR_robustness") && !glu::hasExtension(gl, apiType, "GL_EXT_robustness"))
		TCU_THROW(NotSupportedError, (string("GL_KHR_robustness and GL_EXT_robustness") + " not supported").c_str());
}